

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int ecp_normalize_jac_many(mbedtls_ecp_group *grp,mbedtls_ecp_point **T,size_t T_size)

{
  int iVar1;
  mbedtls_mpi *arr;
  mbedtls_mpi *pmVar2;
  long lVar3;
  size_t sVar4;
  bool bVar5;
  undefined1 local_58 [8];
  mbedtls_mpi t;
  
  if (T_size < 2) {
    iVar1 = ecp_normalize_jac(grp,*T);
    return iVar1;
  }
  arr = (mbedtls_mpi *)calloc(T_size,0x10);
  if (arr == (mbedtls_mpi *)0x0) {
    iVar1 = -0x4d80;
  }
  else {
    mbedtls_mpi_init((mbedtls_mpi *)local_58);
    mpi_init_many(arr,T_size);
    iVar1 = mbedtls_mpi_copy(arr,&(*T)->Z);
    if (iVar1 == 0) {
      sVar4 = 1;
      pmVar2 = arr;
      t._8_8_ = arr;
      do {
        arr = (mbedtls_mpi *)t._8_8_;
        if (T_size == sVar4) {
          lVar3 = T_size - 1;
          pmVar2 = (mbedtls_mpi *)(lVar3 * 0x10 + t._8_8_);
          iVar1 = mbedtls_mpi_inv_mod(pmVar2,pmVar2,&grp->P);
          if (iVar1 == 0) {
            pmVar2 = (mbedtls_mpi *)(T_size * 0x10 + (long)arr + -0x20);
            goto LAB_001ef069;
          }
          break;
        }
        iVar1 = mbedtls_mpi_mul_mod(grp,pmVar2 + 1,pmVar2,&T[sVar4]->Z);
        sVar4 = sVar4 + 1;
        pmVar2 = pmVar2 + 1;
        arr = (mbedtls_mpi *)t._8_8_;
      } while (iVar1 == 0);
    }
LAB_001eefbc:
    mbedtls_mpi_free((mbedtls_mpi *)local_58);
    mpi_free_many(arr,T_size);
    free(arr);
  }
  return iVar1;
LAB_001ef069:
  if (lVar3 == 0) {
    iVar1 = mbedtls_mpi_copy((mbedtls_mpi *)local_58,arr);
  }
  else {
    iVar1 = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)local_58,pmVar2 + 1,pmVar2);
    if (iVar1 != 0) goto LAB_001eefbc;
    iVar1 = mbedtls_mpi_mul_mod(grp,pmVar2,pmVar2 + 1,&T[lVar3]->Z);
  }
  if (iVar1 != 0) goto LAB_001eefbc;
  iVar1 = mbedtls_mpi_mul_mod(grp,&T[lVar3]->Y,&T[lVar3]->Y,(mbedtls_mpi *)local_58);
  if (((((iVar1 != 0) ||
        (iVar1 = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)local_58,(mbedtls_mpi *)local_58,
                                     (mbedtls_mpi *)local_58), iVar1 != 0)) ||
       (iVar1 = mbedtls_mpi_mul_mod(grp,&T[lVar3]->X,&T[lVar3]->X,(mbedtls_mpi *)local_58),
       iVar1 != 0)) ||
      ((iVar1 = mbedtls_mpi_mul_mod(grp,&T[lVar3]->Y,&T[lVar3]->Y,(mbedtls_mpi *)local_58),
       iVar1 != 0 || (iVar1 = mbedtls_mpi_shrink(&T[lVar3]->X,(ulong)(grp->P).n), iVar1 != 0)))) ||
     (iVar1 = mbedtls_mpi_shrink(&T[lVar3]->Y,(ulong)(grp->P).n), iVar1 != 0)) goto LAB_001eefbc;
  iVar1 = mbedtls_mpi_lset(&T[lVar3]->Z,1);
  bVar5 = lVar3 == 0;
  lVar3 = lVar3 + -1;
  if ((bVar5) || (pmVar2 = pmVar2 + -1, iVar1 != 0)) goto LAB_001eefbc;
  goto LAB_001ef069;
}

Assistant:

static int ecp_normalize_jac_many(const mbedtls_ecp_group *grp,
                                  mbedtls_ecp_point *T[], size_t T_size)
{
    if (T_size < 2) {
        return ecp_normalize_jac(grp, *T);
    }

#if defined(MBEDTLS_ECP_NORMALIZE_JAC_MANY_ALT)
    if (mbedtls_internal_ecp_grp_capable(grp)) {
        return mbedtls_internal_ecp_normalize_jac_many(grp, T, T_size);
    }
#endif

#if defined(MBEDTLS_ECP_NO_FALLBACK) && defined(MBEDTLS_ECP_NORMALIZE_JAC_MANY_ALT)
    return MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE;
#else
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;
    mbedtls_mpi *c, t;

    if ((c = mbedtls_calloc(T_size, sizeof(mbedtls_mpi))) == NULL) {
        return MBEDTLS_ERR_ECP_ALLOC_FAILED;
    }

    mbedtls_mpi_init(&t);

    mpi_init_many(c, T_size);
    /*
     * c[i] = Z_0 * ... * Z_i,   i = 0,..,n := T_size-1
     */
    MPI_ECP_MOV(&c[0], &T[0]->Z);
    for (i = 1; i < T_size; i++) {
        MPI_ECP_MUL(&c[i], &c[i-1], &T[i]->Z);
    }

    /*
     * c[n] = 1 / (Z_0 * ... * Z_n) mod P
     */
    MPI_ECP_INV(&c[T_size-1], &c[T_size-1]);

    for (i = T_size - 1;; i--) {
        /* At the start of iteration i (note that i decrements), we have
         * - c[j] = Z_0 * .... * Z_j        for j  < i,
         * - c[j] = 1 / (Z_0 * .... * Z_j)  for j == i,
         *
         * This is maintained via
         * - c[i-1] <- c[i] * Z_i
         *
         * We also derive 1/Z_i = c[i] * c[i-1] for i>0 and use that
         * to do the actual normalization. For i==0, we already have
         * c[0] = 1 / Z_0.
         */

        if (i > 0) {
            /* Compute 1/Z_i and establish invariant for the next iteration. */
            MPI_ECP_MUL(&t,      &c[i], &c[i-1]);
            MPI_ECP_MUL(&c[i-1], &c[i], &T[i]->Z);
        } else {
            MPI_ECP_MOV(&t, &c[0]);
        }

        /* Now t holds 1 / Z_i; normalize as in ecp_normalize_jac() */
        MPI_ECP_MUL(&T[i]->Y, &T[i]->Y, &t);
        MPI_ECP_SQR(&t,       &t);
        MPI_ECP_MUL(&T[i]->X, &T[i]->X, &t);
        MPI_ECP_MUL(&T[i]->Y, &T[i]->Y, &t);

        /*
         * Post-precessing: reclaim some memory by shrinking coordinates
         * - not storing Z (always 1)
         * - shrinking other coordinates, but still keeping the same number of
         *   limbs as P, as otherwise it will too likely be regrown too fast.
         */
        MBEDTLS_MPI_CHK(mbedtls_mpi_shrink(&T[i]->X, grp->P.n));
        MBEDTLS_MPI_CHK(mbedtls_mpi_shrink(&T[i]->Y, grp->P.n));

        MPI_ECP_LSET(&T[i]->Z, 1);

        if (i == 0) {
            break;
        }
    }

cleanup:

    mbedtls_mpi_free(&t);
    mpi_free_many(c, T_size);
    mbedtls_free(c);

    return ret;
#endif /* !defined(MBEDTLS_ECP_NO_FALLBACK) || !defined(MBEDTLS_ECP_NORMALIZE_JAC_MANY_ALT) */
}